

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_atomic_test.c
# Opt level: O0

char * test_recorded_values(void)

{
  _Bool _Var1;
  int64_t count_added_in_this_bucket_1;
  int64_t count_added_in_this_bucket;
  int64_t total_added_count;
  undefined1 local_90 [4];
  int index;
  hdr_iter iter;
  
  count_added_in_this_bucket = 0;
  load_histograms();
  hdr_iter_recorded_init((hdr_iter *)local_90,raw_histogram);
  total_added_count._4_4_ = 0;
  while (_Var1 = hdr_iter_next((hdr_iter *)local_90), _Var1) {
    if (total_added_count._4_4_ == 0) {
      if (iter.value_iterated_to != 10000) {
        iter._next_fp = (_func__Bool_hdr_iter_ptr *)anon_var_dwarf_3ff;
        return (char *)iter._next_fp;
      }
    }
    else if (iter.value_iterated_to != 1) {
      iter._next_fp = (_func__Bool_hdr_iter_ptr *)anon_var_dwarf_409;
      return (char *)iter._next_fp;
    }
    total_added_count._4_4_ = total_added_count._4_4_ + 1;
  }
  if (total_added_count._4_4_ == 2) {
    hdr_iter_recorded_init((hdr_iter *)local_90,cor_histogram);
    total_added_count._4_4_ = 0;
    while (_Var1 = hdr_iter_next((hdr_iter *)local_90), _Var1) {
      if ((total_added_count._4_4_ == 0) && (iter.value_iterated_to != 10000)) {
        iter._next_fp = (_func__Bool_hdr_iter_ptr *)anon_var_dwarf_429;
        return (char *)iter._next_fp;
      }
      if (iter.total_count == 0) {
        iter._next_fp = (_func__Bool_hdr_iter_ptr *)anon_var_dwarf_434;
        return (char *)iter._next_fp;
      }
      if (iter.total_count != iter.value_iterated_to) {
        iter._next_fp = (_func__Bool_hdr_iter_ptr *)anon_var_dwarf_43f;
        return (char *)iter._next_fp;
      }
      count_added_in_this_bucket = iter.value_iterated_to + count_added_in_this_bucket;
      total_added_count._4_4_ = total_added_count._4_4_ + 1;
    }
    if (count_added_in_this_bucket == 20000) {
      iter._next_fp = (_func__Bool_hdr_iter_ptr *)0x0;
    }
    else {
      iter._next_fp = (_func__Bool_hdr_iter_ptr *)anon_var_dwarf_456;
    }
  }
  else {
    iter._next_fp = (_func__Bool_hdr_iter_ptr *)anon_var_dwarf_41f;
  }
  return (char *)iter._next_fp;
}

Assistant:

static char* test_recorded_values(void)
{
    struct hdr_iter iter;
    int index;
    int64_t total_added_count = 0;

    load_histograms();

    /* Raw Histogram */
    hdr_iter_recorded_init(&iter, raw_histogram);

    index = 0;
    while (hdr_iter_next(&iter))
    {
        int64_t count_added_in_this_bucket = iter.specifics.recorded.count_added_in_this_iteration_step;
        if (index == 0)
        {
            mu_assert("Value at 0 is not 10000", count_added_in_this_bucket == 10000);
        }
        else
        {
            mu_assert("Value at 1 is not 1", count_added_in_this_bucket == 1);
        }

        index++;
    }
    mu_assert("Should have encountered 2 values", index == 2);

    /* Corrected Histogram */
    hdr_iter_recorded_init(&iter, cor_histogram);

    index = 0;
    while (hdr_iter_next(&iter))
    {
        int64_t count_added_in_this_bucket = iter.specifics.recorded.count_added_in_this_iteration_step;
        if (index == 0)
        {
            mu_assert("Count at 0 is not 10000", count_added_in_this_bucket == 10000);
        }
        mu_assert("Count should not be 0", iter.count != 0);
        mu_assert("Count at value iterated to should be count added in this step",
                  iter.count == count_added_in_this_bucket);
        total_added_count += count_added_in_this_bucket;
        index++;
    }
    mu_assert("Total counts should be 20000", total_added_count == 20000);

    return 0;
}